

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidateDocumentFinal(xmlValidCtxtPtr ctxt,xmlDocPtr doc)

{
  uint uVar1;
  xmlHashTablePtr table_00;
  uint save;
  xmlRefTablePtr table;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else if (doc == (xmlDocPtr)0x0) {
    xmlErrValid(ctxt,XML_DTD_NO_DOC,"xmlValidateDocumentFinal: doc == NULL\n",(char *)0x0);
    ctxt_local._4_4_ = 0;
  }
  else {
    uVar1 = ctxt->finishDtd;
    ctxt->finishDtd = 0;
    table_00 = (xmlHashTablePtr)doc->refs;
    ctxt->doc = doc;
    ctxt->valid = 1;
    xmlHashScan(table_00,xmlValidateCheckRefCallback,ctxt);
    ctxt->finishDtd = uVar1;
    ctxt_local._4_4_ = ctxt->valid;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlValidateDocumentFinal(xmlValidCtxtPtr ctxt, xmlDocPtr doc) {
    xmlRefTablePtr table;
    unsigned int save;

    if (ctxt == NULL)
        return(0);
    if (doc == NULL) {
        xmlErrValid(ctxt, XML_DTD_NO_DOC,
		"xmlValidateDocumentFinal: doc == NULL\n", NULL);
	return(0);
    }

    /* trick to get correct line id report */
    save = ctxt->finishDtd;
    ctxt->finishDtd = 0;

    /*
     * Check all the NOTATION/NOTATIONS attributes
     */
    /*
     * Check all the ENTITY/ENTITIES attributes definition for validity
     */
    /*
     * Check all the IDREF/IDREFS attributes definition for validity
     */
    table = (xmlRefTablePtr) doc->refs;
    ctxt->doc = doc;
    ctxt->valid = 1;
    xmlHashScan(table, xmlValidateCheckRefCallback, ctxt);

    ctxt->finishDtd = save;
    return(ctxt->valid);
}